

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tick.cpp
# Opt level: O0

void __thiscall MetaSim::Tick::Tick(Tick *this,string *s)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  long *in_RDI;
  string *in_stack_00000010;
  double *in_stack_00000018;
  string *in_stack_00000020;
  double num;
  string unit;
  string *in_stack_00000140;
  string *in_stack_00000148;
  ParseExc *in_stack_00000150;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  allocator local_69;
  string local_68 [48];
  double local_38;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  parse_util::parse_double(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,
                                   CONCAT16(in_stack_ffffffffffffff66,
                                            CONCAT15(in_stack_ffffffffffffff65,
                                                     CONCAT14(in_stack_ffffffffffffff64,
                                                              in_stack_ffffffffffffff60)))),
                          in_stack_ffffffffffffff58);
  if ((((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58), bVar1)) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff67,
                                        CONCAT16(in_stack_ffffffffffffff66,
                                                 CONCAT15(in_stack_ffffffffffffff65,
                                                          CONCAT14(in_stack_ffffffffffffff64,
                                                                   in_stack_ffffffffffffff60)))),
                               in_stack_ffffffffffffff58), bVar1)) &&
     ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff67,
                                        CONCAT16(in_stack_ffffffffffffff66,
                                                 CONCAT15(in_stack_ffffffffffffff65,
                                                          CONCAT14(in_stack_ffffffffffffff64,
                                                                   in_stack_ffffffffffffff60)))),
                               in_stack_ffffffffffffff58), bVar1 &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff67,
                                        CONCAT16(in_stack_ffffffffffffff66,
                                                 CONCAT15(in_stack_ffffffffffffff65,
                                                          CONCAT14(in_stack_ffffffffffffff64,
                                                                   in_stack_ffffffffffffff60)))),
                               in_stack_ffffffffffffff58), bVar1)))) {
    uVar5 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Cannot understand time unit: ",&local_69);
    parse_util::ParseExc::ParseExc(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    __cxa_throw(uVar5,&parse_util::ParseExc::typeinfo,parse_util::ParseExc::~ParseExc);
  }
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,
                                   CONCAT16(in_stack_ffffffffffffff66,
                                            CONCAT15(in_stack_ffffffffffffff65,
                                                     CONCAT14(in_stack_ffffffffffffff64,
                                                              in_stack_ffffffffffffff60)))),
                          in_stack_ffffffffffffff58);
  if ((bool)uVar2) {
    *in_RDI = (long)((local_38 * (double)default_unit) / (double)resolution);
  }
  else {
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                                    CONCAT15(in_stack_ffffffffffffff65,
                                                             CONCAT14(in_stack_ffffffffffffff64,
                                                                      in_stack_ffffffffffffff60)))),
                            in_stack_ffffffffffffff58);
    if ((bool)uVar3) {
      *in_RDI = (long)((local_38 * 1000000000.0) / (double)resolution);
    }
    else {
      uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff65,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                              in_stack_ffffffffffffff58);
      if ((bool)uVar4) {
        *in_RDI = (long)((local_38 * 1000000.0) / (double)resolution);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          *in_RDI = (long)((local_38 * 1000.0) / (double)resolution);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(bVar1,
                                                  in_stack_ffffffffffffff60)))),
                                  in_stack_ffffffffffffff58);
          if (bVar1) {
            *in_RDI = (long)(local_38 / (double)resolution);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

Tick::Tick(const string &s)
    {
        string unit;
        double num;

        parse_double(s, num, unit);

        if (unit != "s" && unit != "ms" && unit != "us" && unit != "ns" && unit != "") 
            throw ParseExc("Cannot understand time unit: ", unit);

        if (unit == "") { v = (impl_t)((num * default_unit) / resolution); }
        else if (unit == "s") { v = (impl_t)((num * 1000000000) / resolution);}
        else if (unit == "ms")  { v = (impl_t)((num * 1000000) / resolution); }
        else if (unit == "us")  { v = (impl_t)((num * 1000) / resolution); }
        else if (unit == "ns")  { v = (impl_t)((num) / resolution); }
    }